

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddUtilityCommand
          (cmMakefile *this,string *utilityName,bool excludeFromAll,char *workingDirectory,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,bool escapeOldStyle,char *comment,
          bool uses_terminal)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  cmTarget *this_01;
  char *pcVar2;
  cmSourceFile *pcVar3;
  reference sourceName;
  allocator local_159;
  string local_158;
  cmSourceFile *local_138;
  cmSourceFile *out;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  const_iterator o;
  string local_118;
  cmSourceFile *local_f8;
  cmSourceFile *sf;
  undefined1 local_e8 [6];
  bool no_replace;
  string no_main_dependency;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forced;
  undefined1 local_a8 [8];
  string force;
  allocator local_71;
  string local_70;
  cmTarget *local_50;
  cmTarget *target;
  bool uses_terminal_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_40;
  bool escapeOldStyle_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  char *workingDirectory_local;
  string *psStack_20;
  bool excludeFromAll_local;
  string *utilityName_local;
  cmMakefile *this_local;
  
  target._7_1_ = escapeOldStyle;
  target._6_1_ = uses_terminal;
  pvStack_40 = depends;
  depends_local = byproducts;
  byproducts_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)workingDirectory;
  workingDirectory_local._7_1_ = excludeFromAll;
  psStack_20 = utilityName;
  utilityName_local = (string *)this;
  this_01 = AddNewTarget(this,UTILITY,utilityName);
  local_50 = this_01;
  if ((workingDirectory_local._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"EXCLUDE_FROM_ALL",&local_71);
    cmTarget::SetProperty(this_01,&local_70,"TRUE");
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if (comment == (char *)0x0) {
    comment = "";
  }
  bVar1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                    (&commandLines->
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((!bVar1) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(pvStack_40), !bVar1)) {
    pcVar2 = GetCurrentBinaryDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a8,pcVar2,
               (allocator *)
               ((long)&forced.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&forced.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar2 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)local_a8,pcVar2);
    std::__cxx11::string::operator+=((string *)local_a8,"/");
    std::__cxx11::string::operator+=((string *)local_a8,(string *)psStack_20);
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&no_main_dependency.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,(value_type *)local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_e8,"",(allocator *)((long)&sf + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sf + 7));
    sf._6_1_ = 0;
    AddCustomCommandToOutput
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&no_main_dependency.field_2 + 8),depends_local,pvStack_40,
               (string *)local_e8,commandLines,comment,(char *)byproducts_local,false,
               (bool)(target._7_1_ & 1),(bool)(target._6_1_ & 1));
    pcVar3 = cmTarget::AddSourceCMP0049(local_50,(string *)local_a8);
    local_f8 = pcVar3;
    if (pcVar3 == (cmSourceFile *)0x0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error("Could not get source file entry for ",pcVar2,(char *)0x0,(char *)0x0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,"SYMBOLIC",(allocator *)((long)&o._M_current + 7));
      cmSourceFile::SetProperty(pcVar3,&local_118,"1");
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&o._M_current + 7));
    }
    local_128._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(depends_local);
    while( true ) {
      out = (cmSourceFile *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(depends_local);
      bVar1 = __gnu_cxx::operator!=
                        (&local_128,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&out);
      if (!bVar1) break;
      sourceName = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_128);
      pcVar3 = GetOrCreateSource(this,sourceName,true);
      local_138 = pcVar3;
      if (pcVar3 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,"GENERATED",&local_159);
        cmSourceFile::SetProperty(pcVar3,&local_158,"1");
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_128);
    }
    std::__cxx11::string::~string((string *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&no_main_dependency.field_2 + 8));
    std::__cxx11::string::~string((string *)local_a8);
  }
  return local_50;
}

Assistant:

cmTarget*
cmMakefile::AddUtilityCommand(const std::string& utilityName,
                              bool excludeFromAll,
                              const char* workingDirectory,
                              const std::vector<std::string>& byproducts,
                              const std::vector<std::string>& depends,
                              const cmCustomCommandLines& commandLines,
                              bool escapeOldStyle, const char* comment,
                              bool uses_terminal)
{
  // Create a target instance for this utility.
  cmTarget* target = this->AddNewTarget(cmState::UTILITY, utilityName);
  if (excludeFromAll)
    {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }
  if(!comment)
    {
    // Use an empty comment to avoid generation of default comment.
    comment = "";
    }

  // Store the custom command in the target.
  if (!commandLines.empty() || !depends.empty())
    {
    std::string force = this->GetCurrentBinaryDirectory();
    force += cmake::GetCMakeFilesDirectory();
    force += "/";
    force += utilityName;
    std::vector<std::string> forced;
    forced.push_back(force);
    std::string no_main_dependency = "";
    bool no_replace = false;
    this->AddCustomCommandToOutput(forced, byproducts,
                                   depends, no_main_dependency,
                                   commandLines, comment,
                                   workingDirectory, no_replace,
                                   escapeOldStyle, uses_terminal);
    cmSourceFile* sf = target->AddSourceCMP0049(force);

    // The output is not actually created so mark it symbolic.
    if(sf)
      {
      sf->SetProperty("SYMBOLIC", "1");
      }
    else
      {
      cmSystemTools::Error("Could not get source file entry for ",
                          force.c_str());
      }

    // Always create the byproduct sources and mark them generated.
    for(std::vector<std::string>::const_iterator o = byproducts.begin();
        o != byproducts.end(); ++o)
      {
      if(cmSourceFile* out = this->GetOrCreateSource(*o, true))
        {
        out->SetProperty("GENERATED", "1");
        }
      }
    }
  return target;
}